

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O2

void __thiscall dlib::drawable::enable(drawable *this)

{
  auto_mutex M;
  
  M.r = this->m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  this->enabled = true;
  base_window::invalidate_rectangle(&this->parent->super_base_window,&this->rect);
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

virtual void enable (
        ) 
        {
            auto_mutex M(m);
            enabled = true;
            parent.invalidate_rectangle(rect);
        }